

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_isPublicId(ENCODING *enc,char *ptr,char *end,char **badPtr)

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  ulong uVar4;
  
  pbVar2 = (byte *)(ptr + 2);
  do {
    if (pbVar2 == (byte *)(end + -2)) {
      return 1;
    }
    bVar1 = *pbVar2;
    if (bVar1 == 0) {
      bVar3 = *(byte *)((long)enc[1].scanners + (ulong)pbVar2[1]);
    }
    else {
      bVar3 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 - 0xdc < 4) {
          bVar3 = 8;
        }
        else if ((bVar1 == 0xff) && (0xfd < pbVar2[1])) {
          bVar3 = 0;
        }
        else {
          bVar3 = 0x1d;
        }
      }
    }
    if (bVar3 < 0x24) {
      uVar4 = (ulong)bVar3;
      if ((0xfcb8fe600U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x4400000UL >> (uVar4 & 0x3f) & 1) == 0) {
          if (uVar4 != 0x15) goto LAB_0015de16;
          if ((bVar1 == 0) && (pbVar2[1] == 9)) goto LAB_0015de32;
        }
        else {
          bVar3 = 0xff;
          if (bVar1 != 0) goto LAB_0015de26;
          if ((char)pbVar2[1] < '\0') goto LAB_0015de16;
        }
      }
    }
    else {
LAB_0015de16:
      bVar3 = 0xff;
      if (bVar1 == 0) {
        bVar3 = pbVar2[1];
      }
LAB_0015de26:
      if ((bVar3 != 0x40) && (bVar3 != 0x24)) {
LAB_0015de32:
        *badPtr = (char *)pbVar2;
        return 0;
      }
    }
    pbVar2 = pbVar2 + 2;
  } while( true );
}

Assistant:

static
int PREFIX(isPublicId)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **badPtr)
{
  ptr += MINBPC(enc);
  end -= MINBPC(enc);
  for (; ptr != end; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
    case BT_HEX:
    case BT_MINUS:
    case BT_APOS:
    case BT_LPAR:
    case BT_RPAR:
    case BT_PLUS:
    case BT_COMMA:
    case BT_SOL:
    case BT_EQUALS:
    case BT_QUEST:
    case BT_CR:
    case BT_LF:
    case BT_SEMI:
    case BT_EXCL:
    case BT_AST:
    case BT_PERCNT:
    case BT_NUM:
#ifdef XML_NS
    case BT_COLON:
#endif
      break;
    case BT_S:
      if (CHAR_MATCHES(enc, ptr, ASCII_TAB)) {
        *badPtr = ptr;
        return 0;
      }
      break;
    case BT_NAME:
    case BT_NMSTRT:
      if (!(BYTE_TO_ASCII(enc, ptr) & ~0x7f))
        break;
    default:
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case 0x24: /* $ */
      case 0x40: /* @ */
        break;
      default:
        *badPtr = ptr;
        return 0;
      }
      break;
    }
  }
  return 1;
}